

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O0

void __thiscall
license::test::generate_license_features::test_method(generate_license_features *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  lazy_ostream *plVar5;
  value_type *a_pszFile;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]> local_308;
  assertion_result local_2e8;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[47],_const_char_(&)[47]> local_2a0;
  assertion_result local_280;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  undefined1 local_248 [8];
  CSimpleIniA ini;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]> local_1d0;
  assertion_result local_1b0;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  License license;
  string lic_location_str;
  path local_50;
  undefined1 local_30 [8];
  path licFile;
  generate_license_features *this_local;
  
  licFile.m_pathname.field_2._8_8_ = this;
  boost::filesystem::path::path(&local_50,"myclient2.lic");
  boost::filesystem::operator/((path *)local_30,(path *)MyGlobalFixture::licenses_path,&local_50);
  boost::filesystem::path::~path(&local_50);
  psVar4 = boost::filesystem::path::string_abi_cxx11_((path *)local_30);
  std::__cxx11::string::string
            ((string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)psVar4);
  psVar4 = boost::filesystem::path::string_abi_cxx11_((path *)MyGlobalFixture::project_path);
  License::License((License *)local_128,
                   (string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   psVar4,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"feature-names",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"my_fantastic_softwAre,another_feature",&local_171);
  License::add_parameter((License *)local_128,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  License::write_license((License *)local_128);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_198);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_188,0x76,&local_198);
    bVar2 = boost::filesystem::exists((path *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_1b0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d0,plVar5,(char (*) [25])"license has been created");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&ini.m_bStoreIsUtf8,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::test_tools::tt_detail::report_assertion
              (&local_1b0,&local_1d0,&ini.m_bStoreIsUtf8,0x76,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>::
    ~lazy_ostream_impl(&local_1d0);
    boost::test_tools::assertion_result::~assertion_result(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_248,false,
             false,false);
  a_pszFile = boost::filesystem::path::c_str((path *)local_30);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_248,
             a_pszFile);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_268);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_258,0x7a,&local_268);
    iVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                      ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                       local_248,"MY_FANTASTIC_SOFTWARE");
    boost::test_tools::assertion_result::assertion_result(&local_280,iVar3 == 2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_2a0,plVar5,(char (*) [47])"Section [MY_FANTASTIC_SOFTWARE] has 2 elements");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::test_tools::tt_detail::report_assertion(&local_280,&local_2a0,&local_2b0,0x7a,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[47],_const_char_(&)[47]>::
    ~lazy_ostream_impl(&local_2a0);
    boost::test_tools::assertion_result::~assertion_result(&local_280);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2c0,0x7b,&local_2d0);
    iVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                      ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                       local_248,"ANOTHER_FEATURE");
    boost::test_tools::assertion_result::assertion_result(&local_2e8,iVar3 == 2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_308,plVar5,(char (*) [41])"Section [ANOTHER_FEATURE] has 2 elements");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::test_tools::tt_detail::report_assertion(&local_2e8,&local_308,&local_318,0x7b,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>::
    ~lazy_ostream_impl(&local_308);
    boost::test_tools::assertion_result::~assertion_result(&local_2e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_248);
  License::~License((License *)local_128);
  std::__cxx11::string::~string
            ((string *)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  boost::filesystem::path::~path((path *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generate_license_features) {
	const fs::path licFile = MyGlobalFixture::licenses_path / "myclient2.lic";
	const string lic_location_str = licFile.string();
	License license(&lic_location_str, MyGlobalFixture::project_path.string());
	license.add_parameter(PARAM_FEATURE_NAMES, "my_fantastic_softwAre,another_feature");
	license.write_license();
	BOOST_REQUIRE_MESSAGE(fs::exists(licFile), "license has been created");
	CSimpleIniA ini;
	ini.LoadFile(licFile.c_str());
	BOOST_CHECK_MESSAGE(ini.GetSectionSize("MY_FANTASTIC_SOFTWARE") == 2,
						"Section [MY_FANTASTIC_SOFTWARE] has 2 elements");
	BOOST_CHECK_MESSAGE(ini.GetSectionSize("ANOTHER_FEATURE") == 2, "Section [ANOTHER_FEATURE] has 2 elements");
}